

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translit.cpp
# Opt level: O2

Transliterator * __thiscall
icu_63::Transliterator::operator=(Transliterator *this,Transliterator *other)

{
  int iVar1;
  undefined4 extraout_var;
  UnicodeFilter *pUVar2;
  
  icu_63::UnicodeString::operator=(&this->ID,&other->ID);
  icu_63::UnicodeString::getTerminatedBuffer(&this->ID);
  this->maximumContextLength = other->maximumContextLength;
  if (other->filter == (UnicodeFilter *)0x0) {
    pUVar2 = (UnicodeFilter *)0x0;
  }
  else {
    iVar1 = (*(other->filter->super_UnicodeFunctor).super_UObject._vptr_UObject[3])();
    pUVar2 = (UnicodeFilter *)CONCAT44(extraout_var,iVar1);
  }
  if (this->filter != (UnicodeFilter *)0x0) {
    (*(this->filter->super_UnicodeFunctor).super_UObject._vptr_UObject[1])();
  }
  this->filter = pUVar2;
  return this;
}

Assistant:

Transliterator& Transliterator::operator=(const Transliterator& other) {
    ID = other.ID;
    // NUL-terminate the ID string
    ID.getTerminatedBuffer();

    maximumContextLength = other.maximumContextLength;
    adoptFilter((other.filter == 0) ? 0 : (UnicodeFilter*) other.filter->clone());
    return *this;
}